

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

size_t aead_do_decrypt(ptls_aead_context_t *_ctx,void *_output,void *input,size_t inlen,void *iv,
                      void *aad,size_t aadlen)

{
  int iVar1;
  int local_64;
  int ret;
  int blocklen;
  size_t tag_size;
  size_t off;
  uint8_t *output;
  aead_crypto_context_t *ctx;
  void *aad_local;
  void *iv_local;
  size_t inlen_local;
  void *input_local;
  void *_output_local;
  ptls_aead_context_t *_ctx_local;
  
  tag_size = 0;
  _ret = _ctx->algo->tag_size;
  if (inlen < _ret) {
    _ctx_local = (ptls_aead_context_t *)0xffffffffffffffff;
  }
  else {
    off = (size_t)_output;
    output = (uint8_t *)_ctx;
    ctx = (aead_crypto_context_t *)aad;
    aad_local = iv;
    iv_local = (void *)inlen;
    inlen_local = (size_t)input;
    input_local = _output;
    _output_local = _ctx;
    iVar1 = EVP_DecryptInit_ex((EVP_CIPHER_CTX *)_ctx[1].algo,(EVP_CIPHER *)0x0,(ENGINE *)0x0,
                               (uchar *)0x0,(uchar *)iv);
    if (iVar1 == 0) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/openssl.c"
                    ,0x3b7,
                    "size_t aead_do_decrypt(ptls_aead_context_t *, void *, const void *, size_t, const void *, const void *, size_t)"
                   );
    }
    if ((aadlen != 0) &&
       (iVar1 = EVP_DecryptUpdate(*(EVP_CIPHER_CTX **)(output + 0x40),(uchar *)0x0,&local_64,
                                  (uchar *)ctx,(int)aadlen), iVar1 == 0)) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/openssl.c"
                    ,0x3ba,
                    "size_t aead_do_decrypt(ptls_aead_context_t *, void *, const void *, size_t, const void *, const void *, size_t)"
                   );
    }
    iVar1 = EVP_DecryptUpdate(*(EVP_CIPHER_CTX **)(output + 0x40),(uchar *)(off + tag_size),
                              &local_64,(uchar *)inlen_local,(int)iv_local - (int)_ret);
    if (iVar1 == 0) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/openssl.c"
                    ,0x3bd,
                    "size_t aead_do_decrypt(ptls_aead_context_t *, void *, const void *, size_t, const void *, const void *, size_t)"
                   );
    }
    tag_size = (long)local_64 + tag_size;
    iVar1 = EVP_CIPHER_CTX_ctrl(*(EVP_CIPHER_CTX **)(output + 0x40),0x11,(int)_ret,
                                (void *)((long)iv_local + (inlen_local - _ret)));
    if (iVar1 == 0) {
      _ctx_local = (ptls_aead_context_t *)0xffffffffffffffff;
    }
    else {
      iVar1 = EVP_DecryptFinal_ex(*(EVP_CIPHER_CTX **)(output + 0x40),(uchar *)(off + tag_size),
                                  &local_64);
      if (iVar1 == 0) {
        _ctx_local = (ptls_aead_context_t *)0xffffffffffffffff;
      }
      else {
        _ctx_local = (ptls_aead_context_t *)((long)local_64 + tag_size);
      }
    }
  }
  return (size_t)_ctx_local;
}

Assistant:

static size_t aead_do_decrypt(ptls_aead_context_t *_ctx, void *_output, const void *input, size_t inlen, const void *iv,
                              const void *aad, size_t aadlen)
{
    struct aead_crypto_context_t *ctx = (struct aead_crypto_context_t *)_ctx;
    uint8_t *output = _output;
    size_t off = 0, tag_size = ctx->super.algo->tag_size;
    int blocklen, ret;

    if (inlen < tag_size)
        return SIZE_MAX;

    ret = EVP_DecryptInit_ex(ctx->evp_ctx, NULL, NULL, NULL, iv);
    assert(ret);
    if (aadlen != 0) {
        ret = EVP_DecryptUpdate(ctx->evp_ctx, NULL, &blocklen, aad, (int)aadlen);
        assert(ret);
    }
    ret = EVP_DecryptUpdate(ctx->evp_ctx, output + off, &blocklen, input, (int)(inlen - tag_size));
    assert(ret);
    off += blocklen;
    if (!EVP_CIPHER_CTX_ctrl(ctx->evp_ctx, EVP_CTRL_GCM_SET_TAG, (int)tag_size, (void *)((uint8_t *)input + inlen - tag_size)))
        return SIZE_MAX;
    if (!EVP_DecryptFinal_ex(ctx->evp_ctx, output + off, &blocklen))
        return SIZE_MAX;
    off += blocklen;

    return off;
}